

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O1

cram_index * cram_index_query(cram_fd *fd,int refid,int pos,cram_index *from)

{
  cram_index *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  cram_index *pcVar6;
  ulong uVar7;
  int iVar8;
  
  if (-2 < refid) {
    uVar2 = refid + 1;
    uVar7 = 0;
    if ((int)uVar2 < fd->index_sz) {
      uVar3 = fd->index[uVar2].nslice;
      uVar4 = uVar3 - 1;
      pcVar6 = fd->index + uVar2;
      if (from != (cram_index *)0x0) {
        pcVar6 = from;
      }
      if (2 < uVar3) {
        uVar3 = (int)uVar4 / 2;
        uVar7 = 0;
        uVar2 = uVar4;
        do {
          iVar8 = pcVar6->e[(int)uVar3].refid;
          uVar4 = uVar3;
          if ((iVar8 <= refid) && ((iVar8 < refid || (pcVar6->e[(int)uVar3].start < pos)))) {
            uVar7 = (ulong)uVar3;
            uVar4 = uVar2;
          }
          iVar8 = uVar4 - (int)uVar7;
          uVar3 = iVar8 / 2 + (int)uVar7;
          uVar2 = uVar4;
        } while (2 < iVar8 + 1U);
      }
      pcVar1 = pcVar6->e;
      if ((pcVar1[(int)uVar4].start < pos) && (pcVar1[(int)uVar4].refid == refid)) {
        uVar7 = (ulong)uVar4;
      }
      iVar8 = (int)uVar7;
      if (0 < iVar8) {
        do {
          iVar8 = (int)uVar7;
          if (pcVar1[uVar7 - 1].end < pos) goto LAB_001547d3;
          uVar7 = (ulong)(iVar8 - 1);
        } while (1 < iVar8);
        iVar8 = 0;
      }
LAB_001547d3:
      iVar5 = iVar8 + 1;
      if (((iVar5 < pcVar6->nslice) && (pcVar1[iVar5].start == pos)) &&
         (pcVar1[iVar5].refid == refid)) {
        iVar8 = iVar5;
      }
      return pcVar1 + iVar8;
    }
  }
  return (cram_index *)0x0;
}

Assistant:

cram_index *cram_index_query(cram_fd *fd, int refid, int pos, 
			     cram_index *from) {
    int i, j, k;
    cram_index *e;

    if (refid+1 < 0 || refid+1 >= fd->index_sz)
	return NULL;

    i = 0, j = fd->index[refid+1].nslice-1;

    if (!from)
	from = &fd->index[refid+1];

    for (k = j/2; k != i; k = (j-i)/2 + i) {
	if (from->e[k].refid > refid) {
	    j = k;
	    continue;
	}

	if (from->e[k].refid < refid) {
	    i = k;
	    continue;
	}

	if (from->e[k].start >= pos) {
	    j = k;
	    continue;
	}

	if (from->e[k].start < pos) {
	    i = k;
	    continue;
	}
    }
    // i==j or i==j-1. Check if j is better.
    if (from->e[j].start < pos && from->e[j].refid == refid)
	i = j;

    /* The above found *a* bin overlapping, but not necessarily the first */
    while (i > 0 && from->e[i-1].end >= pos)
	i--;

    /* Special case for matching a start pos */
    if (i+1 < from->nslice &&
	from->e[i+1].start == pos &&
	from->e[i+1].refid == refid)
	i++;

    e = &from->e[i];

    return e;
}